

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHuf.cpp
# Opt level: O2

void anon_unknown.dwarf_13f21e::compressUncompressSubset(unsigned_short *raw,int n)

{
  long lVar1;
  unsigned_short *puVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  unsigned_short *puVar9;
  long lVar10;
  uint local_84;
  long local_80;
  Array<char> compressed;
  Array<unsigned_short> uncompressed;
  
  uVar8 = (ulong)(n * 3 + 0x40000);
  compressed._data = (char *)operator_new__(uVar8);
  compressed._size = uVar8;
  Imf_3_2::Array<unsigned_short>::Array(&uncompressed,(ulong)(uint)n);
  local_84 = n - 1;
  uVar3 = 0x10;
  if (n < 0x11) {
    uVar3 = local_84;
  }
  puVar9 = raw + 1;
  lVar10 = 1;
  local_80 = 2;
  do {
    if ((int)uVar3 <= lVar10) {
      Imf_3_2::Array<unsigned_short>::~Array(&uncompressed);
      Imf_3_2::Array<char>::~Array(&compressed);
      return;
    }
    uVar8 = 0x11;
    if (0x11 < (int)local_84) {
      uVar8 = (ulong)local_84;
    }
    for (uVar8 = uVar8 - 0x10; (long)uVar8 <= n - lVar10; uVar8 = uVar8 + 1) {
      std::operator<<((ostream *)&std::cout,"compressing ");
      std::ostream::flush();
      iVar7 = (int)uVar8;
      iVar4 = Imf_3_2::hufCompress(raw + lVar10,iVar7,compressed._data + lVar10);
      std::operator<<((ostream *)&std::cout,"uncompressing ");
      std::ostream::flush();
      Imf_3_2::hufUncompress(compressed._data + lVar10,iVar4,uncompressed._data + lVar10,iVar7);
      uVar6 = 0;
      while (uVar6 < uVar8) {
        lVar1 = uVar6 * 2;
        puVar2 = puVar9 + uVar6;
        uVar6 = uVar6 + 1;
        if (*(unsigned_short *)((long)uncompressed._data + lVar1 + local_80) != *puVar2) {
          __assert_fail("uncompressed[offset + i] == raw[offset + i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testHuf.cpp"
                        ,0x8b,
                        "void (anonymous namespace)::compressUncompressSubset(const unsigned short *, int)"
                       );
        }
      }
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      poVar5 = std::operator<<(poVar5," bytes, compressed ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
      std::operator<<(poVar5," bytes ");
      poVar5 = std::operator<<((ostream *)&std::cout,"(+");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar10);
      poVar5 = std::operator<<(poVar5,",-");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)(n - lVar10) - iVar7);
      poVar5 = std::operator<<(poVar5,")");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    lVar10 = lVar10 + 1;
    local_84 = local_84 - 1;
    puVar9 = puVar9 + 1;
    local_80 = local_80 + 2;
  } while( true );
}

Assistant:

void
compressUncompressSubset (const unsigned short raw[], int n)
{
    // Test various subsets of the data set

    Array<char>           compressed (3 * n + 4 * 65536);
    Array<unsigned short> uncompressed (n);

    int maxOffset = 16;
    if (n <= maxOffset) { maxOffset = n - 1; }

    for (int offset = 1; offset < maxOffset; ++offset)
    {

        int maxLength = n - offset;
        int minLength = maxLength - 16;
        if (minLength < 1) minLength = 1;

        for (int length = minLength; length <= maxLength; ++length)
        {
            cout << "compressing " << flush;

            int nCompressed =
                hufCompress (raw + offset, length, compressed + offset);

            cout << "uncompressing " << flush;

            hufUncompress (
                compressed + offset,
                nCompressed,
                uncompressed + offset,
                length);

            for (int i = 0; i < length; ++i)
                assert (uncompressed[offset + i] == raw[offset + i]);

            cout << sizeof (raw[0]) * length << " bytes, compressed "
                 << nCompressed << " bytes ";
            cout << "(+" << offset << ",-" << n - offset - length << ")"
                 << endl;
        }
    }
}